

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O2

ChebyshevCollection * __thiscall
ChebTools::ChebyshevCollection::make_inverse
          (ChebyshevCollection *__return_storage_ptr__,ChebyshevCollection *this,size_t N,
          double xmin,double xmax,int Mnorm,double tol,int max_refine_passes,bool assume_monotonic,
          bool unsafe_evaluation)

{
  double dVar1;
  Scalar SVar2;
  double dVar3;
  double xmax_;
  double xmin_;
  double ytol;
  ArrayXd ynodes;
  size_t counter;
  vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_> exps;
  anon_class_64_8_38687d7a get_xsolns;
  anon_class_32_4_ff226609 f;
  optional<std::function<void_(int,_const_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_&)>_>
  *in_stack_fffffffffffffe08;
  undefined1 local_1e9;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  uint local_1d0;
  int local_1cc;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  void *local_1a0 [2];
  undefined8 local_190;
  double local_188;
  undefined1 local_180 [8];
  vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_> local_178;
  _Any_data local_160 [2];
  double local_140;
  DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *local_138;
  double *local_130;
  undefined1 *local_128;
  variable_if_dynamic<long,__1> local_120;
  double *local_118;
  scalar_constant_op<double> local_110;
  RhsNested local_108;
  double *local_100;
  undefined1 local_b8 [88];
  undefined1 local_60 [24];
  scalar_constant_op<double> local_48;
  
  local_1e9 = assume_monotonic;
  local_1e0 = xmax;
  local_1d8 = xmin;
  local_1d0 = Mnorm;
  local_1cc = max_refine_passes;
  local_1c8 = xmax;
  local_1c0 = xmin;
  local_1b0 = tol;
  local_188 = xmax;
  local_180 = (undefined1  [8])xmin;
  if (unsafe_evaluation) {
    local_1e8 = y_unsafe(this,xmin);
    dVar1 = y_unsafe(this,local_1e0);
  }
  else {
    local_1e8 = operator()(this,xmin);
    dVar1 = operator()(this,local_1e0);
  }
  local_1b8 = dVar1;
  dVar3 = local_1e8;
  if (dVar1 < local_1e8) {
    local_1c0 = local_1e0;
    local_1c8 = local_1d8;
    local_1b8 = local_1e8;
    dVar3 = dVar1;
  }
  local_190 = 0;
  local_160[0]._0_8_ = local_1b8 - dVar3;
  local_1e0 = dVar1;
  local_1d8 = dVar3;
  local_178.
  super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)get_CLnodes(N);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)local_60,(double *)local_160,(StorageBaseType *)&local_178);
  local_1a8 = local_1e8 + local_1e0;
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
               *)local_b8,
              (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
               *)local_60,&local_1a8);
  local_140 = 0.5;
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
               *)&local_138,
              (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>>
               *)local_b8,&local_140);
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)local_1a0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_138);
  local_1e8 = Eigen::DenseBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::maxCoeff<0>
                        ((DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)local_1a0);
  SVar2 = Eigen::DenseBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::minCoeff<0>
                    ((DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)local_1a0);
  local_1a8 = (local_1e8 - SVar2) * 2.2e-14;
  local_128 = &local_1e9;
  local_120.m_value = (long)&local_1c8;
  local_118 = &local_1c0;
  local_108.m_expression = (NestedExpressionType)local_180;
  local_100 = &local_188;
  local_48.m_other = (double)&local_190;
  local_138 = (DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)local_1a0;
  local_130 = &local_1a8;
  local_110.m_other = (double)this;
  local_60._0_8_ =
       (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
        *)&local_138;
  local_60._8_8_ = local_100;
  local_60._16_8_ = local_108.m_expression;
  std::function<double(double)>::
  function<ChebTools::ChebyshevCollection::make_inverse(unsigned_long,double,double,int,double,int,bool,bool)const::_lambda(double)_2_&,void>
            ((function<double(double)> *)local_160[0]._M_pod_data,
             (anon_class_32_4_ff226609 *)local_60);
  local_b8[0x20] = false;
  ChebyshevExpansion::
  dyadic_splitting<std::vector<ChebTools::ChebyshevExpansion,std::allocator<ChebTools::ChebyshevExpansion>>>
            (&local_178,(ChebyshevExpansion *)N,(size_t)local_160,
             (function<double_(double)> *)(ulong)local_1d0,local_1d8,local_1b8,local_1cc,local_1b0,
             (int)local_b8,in_stack_fffffffffffffe08);
  std::
  _Optional_payload_base<std::function<void_(int,_const_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_&)>_>
  ::_M_reset((_Optional_payload_base<std::function<void_(int,_const_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_&)>_>
              *)local_b8);
  std::_Function_base::~_Function_base((_Function_base *)local_160);
  ChebyshevCollection(__return_storage_ptr__,&local_178);
  std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
  ~vector(&local_178);
  free(local_1a0[0]);
  return __return_storage_ptr__;
}

Assistant:

auto make_inverse(const std::size_t N, const double xmin, const double xmax,
            const int Mnorm, const double tol, const int max_refine_passes = 8, const bool assume_monotonic = true, const bool unsafe_evaluation=false) const {
            double xmin_ = xmin, xmax_ = xmax;
            double yxmin, yxmax;
            if (unsafe_evaluation){
                yxmin = (*this).y_unsafe(xmin); yxmax = (*this).y_unsafe(xmax);
            }
            else{
                yxmin = (*this)(xmin); yxmax = (*this)(xmax);
            }
            if (yxmin > yxmax) {
                std::swap(yxmin, yxmax);
                std::swap(xmin_, xmax_);
            }
            std::size_t counter = 0;

            // These are the values of y at the Chebyshev-Lobatto nodes for the inverse function
            // in the first pass
            Eigen::ArrayXd ynodes = ((yxmax - yxmin) * ChebTools::get_CLnodes(N).array() + (yxmax + yxmin)) * 0.5;
            // A small fudge factor is needed because there is a tiny loss in precision in calculation of ynodes
            // so it is not adequate to check direct float equality
            auto ytol = 2.2e-14*(ynodes.maxCoeff() - ynodes.minCoeff());

            auto get_xsolns = [&](double y) {
                std::vector<double> xsolns;
                auto ranges_overlap = [](double x1, double x2, double y1, double y2) { return x1 <= y2 && y1 <= x2; };

                // If a value of y precisely matches a value at the node, return the value of x at the node
                // This is important if the value of y is an extremum of y(x)
                if (std::abs(y - ynodes[0]) < ytol && assume_monotonic) { xsolns = { xmax_ }; }
                else if (std::abs(y - ynodes[ynodes.size() - 1]) < ytol && assume_monotonic) { xsolns = { xmin_ }; }
                else {
                    // Solve for values of x given this value of y
                    for (auto& ex : m_exps) {
                        if (assume_monotonic) {
                            auto yvals = ex.get_node_function_values();
                            auto ymin = yvals(0), ymax = yvals(yvals.size() - 1);
                            if (ymin > ymax) {
                                std::swap(ymin, ymax);
                            }
                            if (y >= ymin && y <= ymax) {
                                xsolns.emplace_back(ex.monotonic_solvex(y));
                            }
                        }
                        else {
                            if (ranges_overlap(ex.xmin(), ex.xmax(), xmin, xmax)) {
                                bool only_in_domain = true;
                                for (auto& rt : (ex - y).real_roots2(only_in_domain)) {
                                    xsolns.emplace_back(rt);
                                }
                                bool no_solns = xsolns.empty();
                                if (no_solns){
                                    if (std::abs(y - ynodes[0]) < ytol) { xsolns.push_back(xmax_); }
                                    if (std::abs(y - ynodes[ynodes.size() - 1]) < ytol) { xsolns.push_back(xmin_); }
                                }
                            }
                        }
                    }
                }
                return xsolns;
            };

            auto f = [&](double y) {
                
                auto xsolns = get_xsolns(y);
                auto xtol = 1e-14*(xmax - xmin);
                
                counter++;
                decltype(xsolns) good_solns;
                for (auto & xsoln : xsolns) {
                    if (xsoln >= xmin-xtol && xsoln <= xmax+xtol) {
                        good_solns.push_back(xsoln);
                    }
                }
                auto Ngood_solns = good_solns.size();
                if (Ngood_solns == 1) {
                    return good_solns.front();
                }
                else if (Ngood_solns == 0) {
                    throw std::invalid_argument("No good solutions found for y: " + std::to_string(y) + "; " + std::to_string(xsolns.size()) + " solutions had been found");
                }
                else {
                    for (auto soln : xsolns){
                        std::cout << soln << std::endl;
                    }
                    throw std::invalid_argument("Multiple solutions (is not one-to-one) for y: " + std::to_string(y) + "; " + std::to_string(Ngood_solns) + " solutions found");
                }
            };
            auto exps = ChebyshevExpansion::dyadic_splitting<Container>(N, f, yxmin, yxmax, Mnorm, tol, max_refine_passes);
            return ChebyshevCollection(exps);
        }